

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O0

void ntru_mod3(uint16_t *out,uint16_t *in,uint p,uint q)

{
  uint16_t uVar1;
  uint16_t uVar2;
  uint64_t qrecip_00;
  uint64_t qrecip_01;
  uint local_3c;
  uint16_t residue;
  uint16_t val;
  uint i;
  uint16_t adjust;
  uint bias;
  uint64_t recip3;
  uint64_t qrecip;
  uint q_local;
  uint p_local;
  uint16_t *in_local;
  uint16_t *out_local;
  
  qrecip_00 = reciprocal_for_reduction((uint16_t)q);
  qrecip_01 = reciprocal_for_reduction(3);
  uVar1 = reduce((q >> 1) - 1,3,qrecip_01);
  for (local_3c = 0; local_3c < p; local_3c = local_3c + 1) {
    uVar2 = reduce((uint)in[local_3c] + (q >> 1),(uint16_t)q,qrecip_00);
    uVar2 = reduce((uint)uVar2 + (uint)(ushort)(3 - uVar1),3,qrecip_01);
    out[local_3c] = uVar2 - 1;
  }
  return;
}

Assistant:

void ntru_mod3(uint16_t *out, const uint16_t *in, unsigned p, unsigned q)
{
    uint64_t qrecip = reciprocal_for_reduction(q);
    uint64_t recip3 = reciprocal_for_reduction(3);

    unsigned bias = q/2;
    uint16_t adjust = 3 - reduce(bias-1, 3, recip3);

    for (unsigned i = 0; i < p; i++) {
        uint16_t val = reduce(in[i] + bias, q, qrecip);
        uint16_t residue = reduce(val + adjust, 3, recip3);
        out[i] = residue - 1;
    }
}